

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_tuple.hpp
# Opt level: O0

named_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385192550UL>_>),_int_(named_types::named_tag<std::integral_constant<unsigned_long,_193490482UL>_>),_double_(named_types::named_tag<std::integral_constant<unsigned_long,_6385206976UL>_>),_std::vector<int,_std::allocator<int>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385738401UL>_>)>
* __thiscall
named_types::
make_named_tuple<named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385192550ul>,std::__cxx11::string>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,193490482ul>,int>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385206976ul>,double>,named_types::__attribute_value_holder<std::integral_constant<unsigned_long,6385738401ul>,std::vector<int,std::allocator<int>>>>
          (named_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385192550UL>_>),_int_(named_types::named_tag<std::integral_constant<unsigned_long,_193490482UL>_>),_double_(named_types::named_tag<std::integral_constant<unsigned_long,_6385206976UL>_>),_std::vector<int,_std::allocator<int>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385738401UL>_>)>
           *__return_storage_ptr__,named_types *this,
          __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args,__attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int>
                *args_1,
          __attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
          *args_2,__attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
                  *args_3)

{
  vector<int,_std::allocator<int>_> local_88;
  double local_70 [3];
  int local_54;
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [4];
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
  *local_30;
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
  *args_local_3;
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
  *args_local_2;
  __attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int> *args_local_1;
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args_local;
  
  local_30 = (__attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
              *)args_2;
  args_local_3 = (__attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
                  *)args_1;
  args_local_2 = (__attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
                  *)args;
  args_local_1 = (__attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int>
                  *)this;
  args_local = (__attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385192550UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get(local_50);
  local_54 = __attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int>::get
                       ((__attribute_value_holder<std::integral_constant<unsigned_long,_193490482UL>,_int>
                         *)args_local_2);
  local_70[0] = __attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
                ::get((__attribute_value_holder<std::integral_constant<unsigned_long,_6385206976UL>,_double>
                       *)args_local_3);
  __attribute_value_holder<std::integral_constant<unsigned_long,_6385738401UL>,_std::vector<int,_std::allocator<int>_>_>
  ::get(&local_88,local_30);
  named_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385192550UL>_>),_int_(named_types::named_tag<std::integral_constant<unsigned_long,_193490482UL>_>),_double_(named_types::named_tag<std::integral_constant<unsigned_long,_6385206976UL>_>),_std::vector<int,_std::allocator<int>_>_(named_types::named_tag<std::integral_constant<unsigned_long,_6385738401UL>_>)>
  ::tuple(__return_storage_ptr__,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,&local_54,
          local_70,&local_88);
  std::vector<int,_std::allocator<int>_>::~vector(&local_88);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline constexpr decltype(auto) make_named_tuple(Types&&... args) {
  return named_tuple<typename Types::tag_func_notation...>(
      std::move(args).get()...);
}